

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O0

void __thiscall c74::max::t_mock_outlet::push(t_mock_outlet *this,t_atom_long value)

{
  reference pvVar1;
  t_symbol *s;
  undefined1 local_30 [8];
  t_atom_vector av;
  t_atom_long value_local;
  t_mock_outlet *this_local;
  
  av.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>::vector
            ((vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> *)local_30);
  std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>::resize
            ((vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> *)local_30,2);
  pvVar1 = std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>::operator[]
                     ((vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> *)local_30,0);
  s = gensym("int");
  atom_setsym(pvVar1,s);
  pvVar1 = std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>::operator[]
                     ((vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> *)local_30,1);
  atom_setlong(pvVar1,(t_atom_long)
                      av.super__Vector_base<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ::push_back(&this->m_messages,
              (vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> *)local_30);
  std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>::~vector
            ((vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_> *)local_30);
  return;
}

Assistant:

void push(t_atom_long value)
    {
        t_atom_vector av;

        av.resize(2);
        atom_setsym(&av[0], gensym("int"));
        atom_setlong(&av[1], value);
        m_messages.push_back(av);
    }